

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.hpp
# Opt level: O2

size_t __thiscall pg::bitset::find_prev(bitset *this,size_t pos)

{
  uint64_t uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  if (1 < pos + 1) {
    uVar2 = pos >> 6;
    uVar4 = ~(-1L << (pos & 0x3f)) & this->_bits[uVar2];
    if (uVar4 != 0) {
      uVar2 = LZCOUNT(uVar4) | pos & 0xffffffffffffffc0;
LAB_00145132:
      return uVar2 ^ 0x3f;
    }
    if (0x3f < pos) {
      lVar3 = uVar2 * -0x40;
      do {
        lVar3 = lVar3 + 0x40;
        uVar1 = this->_bits[uVar2 - 1];
        if (uVar1 != 0) {
          uVar2 = LZCOUNT(uVar1) - lVar3;
          goto LAB_00145132;
        }
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t find_prev(size_t pos) const
    {
        if (pos == 0 or pos == npos) return npos;
        size_t i = block_index(pos);
        uint64_t m = _bits[i] & ~((~uint64_t(0)) << (int)bit_index(pos));
        if (m) {
            return i*64 + bsr(m);
        } else {
            if (i == 0) return npos;
            i -= 1;
            for (;;) {
                if (_bits[i] != 0) return i*64 + bsr(_bits[i]);
                if (i == 0) return npos;
                i--;
            }
        }
    }